

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigSimulateOne(Ivy_FraigMan_t *p)

{
  Ivy_Obj_t *pObj;
  int iVar1;
  Ivy_Man_t *pIVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  long lVar5;
  timespec ts;
  timespec local_28;
  
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_28.tv_sec * -1000000;
  }
  pIVar2 = p->pManAig;
  pVVar3 = pIVar2->vObjs;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      pObj = (Ivy_Obj_t *)pVVar3->pArray[lVar5];
      if ((pObj != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7)) {
        Ivy_NodeSimulate(p,pObj);
        pIVar2 = p->pManAig;
      }
      lVar5 = lVar5 + 1;
      pVVar3 = pIVar2->vObjs;
    } while (lVar5 < pVVar3->nSize);
  }
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  }
  p->timeSim = p->timeSim + lVar5 + lVar4;
  p->nSimRounds = p->nSimRounds + 1;
  return;
}

Assistant:

void Ivy_FraigSimulateOne( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    abctime clk;
clk = Abc_Clock();
    Ivy_ManForEachNode( p->pManAig, pObj, i )
    {
        Ivy_NodeSimulate( p, pObj );
/*
        if ( Ivy_ObjFraig(pObj) == NULL )
            printf( "%3d --- -- %d  :  ", pObj->Id, pObj->fPhase );
        else
            printf( "%3d %3d %2d %d  :  ", pObj->Id, Ivy_Regular(Ivy_ObjFraig(pObj))->Id, Ivy_ObjSatNum(Ivy_Regular(Ivy_ObjFraig(pObj))), pObj->fPhase );
        Extra_PrintBinary( stdout, Ivy_ObjSim(pObj), 30 );
        printf( "\n" );
*/
    }
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}